

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O1

SHEMU_STATUS ShemuMemStore(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ND_UINT8 *pNVar6;
  ND_BOOL NVar7;
  ulong uVar8;
  SHEMU_STATUS SVar9;
  ND_UINT64 NVar10;
  
  uVar8 = Context->ShellcodeBase;
  if (Gla < uVar8) {
LAB_00165290:
    uVar8 = Context->StackBase;
    if (uVar8 <= Gla) {
      uVar1 = Context->StackSize + uVar8;
      if ((Gla < uVar1) &&
         ((Size <= Context->StackSize && uVar8 < Size + Gla) && Size + Gla <= uVar1)) {
        if ((Size != 0) &&
           ((Value != (ND_UINT8 *)0x0 &&
            (pNVar6 = Context->Stack, pNVar6 + (Gla - uVar8) != (ND_UINT8 *)0x0)))) {
          NVar10 = 0;
          do {
            (pNVar6 + (Gla - uVar8))[NVar10] = Value[NVar10];
            NVar10 = NVar10 + 1;
          } while (Size != NVar10);
        }
        goto LAB_00165406;
      }
    }
    uVar8 = Context->ExtMemAccess + 1;
    Context->ExtMemAccess = uVar8;
    SVar9 = 1;
    if ((uVar8 <= Context->MemThreshold) && (Context->AccessMemory != (ShemuMemAccess)0x0)) {
      NVar7 = (*Context->AccessMemory)(Context,Gla,Size,Value,'\x01');
      SVar9 = (SHEMU_STATUS)(NVar7 == '\0');
    }
  }
  else {
    uVar1 = Context->ShellcodeSize + uVar8;
    if ((uVar1 <= Gla) ||
       (uVar2 = Size + Gla, (Context->ShellcodeSize < Size || uVar2 <= uVar8) || uVar1 < uVar2))
    goto LAB_00165290;
    uVar1 = Context->Options;
    if ((uVar1 & 4) != 0) {
      return 0;
    }
    uVar5 = (Context->Icache).Address;
    if (Gla < uVar5) {
LAB_0016536d:
      uVar3 = (Size - 1) + Gla;
      if (uVar5 <= uVar3) {
        NVar10 = (Context->Icache).Size;
        uVar4 = NVar10 + uVar5;
        if ((uVar3 < uVar4) && ((NVar10 != 0 && uVar5 < uVar2) && uVar2 <= uVar4))
        goto LAB_001653a4;
      }
    }
    else {
      NVar10 = (Context->Icache).Size;
      uVar3 = NVar10 + uVar5;
      if ((uVar3 <= Gla) || ((uVar3 < Gla + 1 || Gla + 1 <= uVar5) || NVar10 == 0))
      goto LAB_0016536d;
LAB_001653a4:
      (Context->Icache).Address = 0;
      (Context->Icache).Size = 0;
    }
    if ((uVar1 & 0x20) == 0) {
      if (((Size != 0) && (Value != (ND_UINT8 *)0x0)) &&
         (pNVar6 = Context->Shellcode, pNVar6 + (Gla - uVar8) != (ND_UINT8 *)0x0)) {
        NVar10 = 0;
        do {
          (pNVar6 + (Gla - uVar8))[NVar10] = Value[NVar10];
          NVar10 = NVar10 + 1;
        } while (Size != NVar10);
      }
    }
    else {
      if (Context->AccessShellcode == (ShemuMemAccess)0x0) {
        return 1;
      }
      NVar7 = (*Context->AccessShellcode)(Context,Gla,Size,Value,'\x01');
      if (NVar7 == '\0') {
        return 1;
      }
    }
LAB_00165406:
    SVar9 = 0;
  }
  return SVar9;
}

Assistant:

SHEMU_STATUS
ShemuMemStore(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Value
    )
{
    if (ShemuIsShellcodePtr(Context, Gla, Size))
    {
        // Bypass self-writes, if needed to. No need to invalidate the icache in this case.
        if (!!(Context->Options & SHEMU_OPT_BYPASS_SELF_WRITES))
        {
            return SHEMU_SUCCESS;
        }

        // Flush the instruction cache, if any stored address in it. We can do this AFTER checking
        // for SHEMU_OPT_BYPASS_SELF_WRITES - with that flag set, the shellcode will never be modified.
        if (ShemuIsIcachePtr(Context, Gla, 1) || ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            ShemuFlushIcache(Context);
        }

        // Shellcode access.
        if (0 == (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
        {
            // Shellocode is local copy, we can directly access it.
            ShemuCopyMem(Context->Shellcode + (Gla - Context->ShellcodeBase), Value, Size);
        }
        else
        {
            // Shellcode is directly mapped, we must go through the memory access API. Note that the integrator
            // is free to do whatever it wants with this call - generally, it is a good idea to just discard 
            // modifications. For safety, currently we force the SHEMU_OPT_BYPASS_SELF_WRITES option whenever
            // the SHEMU_OPT_DIRECT_MAPPED_SHELL option is used, to avoid problems.
            if ((ND_NULL == Context->AccessShellcode) ||
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE))
            {
                return SHEMU_ABORT_GLA_OUTSIDE;
            }
        }
    }
    else if (ShemuIsStackPtr(Context, Gla, Size))
    {
        ShemuCopyMem(Context->Stack + (Gla - Context->StackBase), Value, Size);
    }
    else
    {
        ND_BOOL res = ND_FALSE;

        // We allow a maximum number of external memory accesses, due to performance reasons.
        if (++Context->ExtMemAccess > Context->MemThreshold)
        {
            return SHEMU_ABORT_GLA_OUTSIDE;
        }

        // Handling external stores made by the shellcode can be done in a variety of ways by the integrator. Some
        // of the solutions are:
        // - Abort on external stores; this will cause the emulation to immediately stop;
        // - Discard external stores; this is very simple, and it assumes that modified memory addresses will
        //   not be read later on by the shellcode;
        // - Create a store-buffer like structure, where every external store is cached; when a load is issued on
        //   a previously written address, the value from the store-buffer can be returned;
        // For obvious reasons, actually storing the value at the indicated address is a very, very bad idea.
        if (ND_NULL != Context->AccessMemory)
        {
            res = Context->AccessMemory(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE);
        }

        if (res)
        {
            return SHEMU_SUCCESS;
        }

        return SHEMU_ABORT_GLA_OUTSIDE;
    }

    return SHEMU_SUCCESS;
}